

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O0

lest * __thiscall lest::to_string_abi_cxx11_(lest *this,char *txt)

{
  char cVar1;
  allocator local_59;
  string local_58 [32];
  string local_38 [32];
  char *local_18;
  char *txt_local;
  
  cVar1 = *txt;
  local_18 = txt;
  txt_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,1,cVar1,&local_59);
  std::operator+((char *)local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"\'");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)local_38);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return this;
}

Assistant:

inline std::string to_string( char           const & txt ) { return "\'" + std::string( 1, txt ) + "\'" ; }